

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

void xmlValidNormalizeString(xmlChar *str)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  xmlChar xVar3;
  xmlChar *src;
  
  pxVar2 = str + -1;
  do {
    xVar3 = pxVar2[1];
    pxVar2 = pxVar2 + 1;
  } while (xVar3 == ' ');
  do {
    if (xVar3 == ' ') {
      while (xVar3 == ' ') {
        pxVar1 = pxVar2 + 1;
        pxVar2 = pxVar2 + 1;
        xVar3 = *pxVar1;
      }
      if (xVar3 != '\0') {
        xVar3 = ' ';
        goto LAB_0018fa6e;
      }
    }
    else {
      if (xVar3 == '\0') {
        *str = '\0';
        return;
      }
      pxVar2 = pxVar2 + 1;
LAB_0018fa6e:
      *str = xVar3;
      str = str + 1;
    }
    xVar3 = *pxVar2;
  } while( true );
}

Assistant:

static void
xmlValidNormalizeString(xmlChar *str) {
    xmlChar *dst;
    const xmlChar *src;

    if (str == NULL)
        return;
    src = str;
    dst = str;

    while (*src == 0x20) src++;
    while (*src != 0) {
	if (*src == 0x20) {
	    while (*src == 0x20) src++;
	    if (*src != 0)
		*dst++ = 0x20;
	} else {
	    *dst++ = *src++;
	}
    }
    *dst = 0;
}